

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenUndeclChk(Lowerer *this,Instr *instrInsert,Opnd *opnd)

{
  LabelInstr *target;
  Opnd *compareSrc2;
  LabelInstr *instr_00;
  RegOpnd *dstOpnd;
  IntConstOpnd *src1Opnd;
  Instr *instr_01;
  Instr *instr;
  LabelInstr *labelThrow;
  LabelInstr *labelContinue;
  Opnd *opnd_local;
  Instr *instrInsert_local;
  Lowerer *this_local;
  
  target = IR::LabelInstr::New(Label,this->m_func,false);
  compareSrc2 = LoadLibraryValueOpnd(this,instrInsert,ValueUndeclBlockVar);
  InsertCompareBranch(this,opnd,compareSrc2,BrNeq_A,target,instrInsert,false);
  instr_00 = IR::LabelInstr::New(Label,this->m_func,true);
  IR::Instr::InsertBefore(instrInsert,&instr_00->super_Instr);
  dstOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  src1Opnd = IR::IntConstOpnd::New(0x13f9,TyInt32,this->m_func,false);
  instr_01 = IR::Instr::New(RuntimeReferenceError,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,
                            this->m_func);
  IR::Instr::InsertBefore(instrInsert,instr_01);
  LowerUnaryHelperMem(this,instr_01,HelperOp_RuntimeReferenceError,(Opnd *)0x0);
  IR::Instr::InsertBefore(instrInsert,&target->super_Instr);
  return;
}

Assistant:

void
Lowerer::GenUndeclChk(IR::Instr *instrInsert, IR::Opnd *opnd)
{
    IR::LabelInstr *labelContinue = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    InsertCompareBranch(
        opnd,
        LoadLibraryValueOpnd(instrInsert, LibraryValue::ValueUndeclBlockVar),
        Js::OpCode::BrNeq_A, labelContinue, instrInsert);

    IR::LabelInstr *labelThrow = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    instrInsert->InsertBefore(labelThrow);

    IR::Instr *instr = IR::Instr::New(
        Js::OpCode::RuntimeReferenceError,
        IR::RegOpnd::New(TyMachReg, m_func),
        IR::IntConstOpnd::New(SCODE_CODE(JSERR_UseBeforeDeclaration), TyInt32, m_func),
        m_func);
    instrInsert->InsertBefore(instr);
    this->LowerUnaryHelperMem(instr, IR::HelperOp_RuntimeReferenceError);

    instrInsert->InsertBefore(labelContinue);
}